

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void __thiscall Node::Node(Node *this,string *path,uint64_t slash_bits)

{
  std::__cxx11::string::string((string *)this,(string *)path);
  this->slash_bits_ = slash_bits;
  this->mtime_ = -1;
  this->dirty_ = false;
  this->dyndep_pending_ = false;
  this->in_edge_ = (Edge *)0x0;
  (this->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->id_ = -1;
  return;
}

Assistant:

Node(const std::string& path, uint64_t slash_bits)
      : path_(path),
        slash_bits_(slash_bits),
        mtime_(-1),
        dirty_(false),
        dyndep_pending_(false),
        in_edge_(NULL),
        id_(-1) {}